

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCPUWarmup.cpp
# Opt level: O0

float tcu::floatMedian<long,3>(long (*v) [3])

{
  int local_2c;
  int i;
  long temp [3];
  long (*v_local) [3];
  
  for (local_2c = 0; local_2c < 3; local_2c = local_2c + 1) {
    *(long *)(&stack0xffffffffffffffd8 + (long)local_2c * 8) = (*v)[local_2c];
  }
  temp[2] = (long)v;
  std::sort<long*>((long *)&stack0xffffffffffffffd8,temp + 2);
  return (float)temp[0];
}

Assistant:

static inline float floatMedian (const T (&v)[Size])
{
	T temp[Size];
	for (int i = 0; i < Size; i++)
		temp[i] = v[i];

	std::sort(DE_ARRAY_BEGIN(temp), DE_ARRAY_END(temp));

	return Size % 2 == 0
		   ? 0.5f * ((float)temp[Size/2-1] + (float)temp[Size/2])
		   : (float)temp[Size/2];
}